

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_log.cxx
# Opt level: O0

void xray_re::die(char *message,char *file,uint line)

{
  xr_log *this;
  uint line_local;
  char *file_local;
  char *message_local;
  
  this = xr_log::instance();
  xr_log::fatal(this,message,file,line);
  return;
}

Assistant:

void xray_re::die(const char* message, const char* file, unsigned line)
{
	xr_log::instance().fatal(message, file, line);
}